

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CuTest.c
# Opt level: O1

void CuTestInit(CuTest *t,char *name,TestFunction function)

{
  char *pcVar1;
  
  pcVar1 = CuStrCopy(name);
  t->name = pcVar1;
  t->failed = 0;
  t->ran = 0;
  t->message = (char *)0x0;
  t->function = function;
  t->jumpBuf = (jmp_buf *)0x0;
  return;
}

Assistant:

void CuTestInit(CuTest* t, const char* name, TestFunction function)
{
	t->name = CuStrCopy(name);
	t->failed = 0;
	t->ran = 0;
	t->message = NULL;
	t->function = function;
	t->jumpBuf = NULL;
}